

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::printVariableInfo<unsigned_int>
              (Engine *fp,IO *io,Variable<unsigned_int> *variable)

{
  ulong uVar1;
  byte bVar2;
  reference pvVar3;
  size_type sVar4;
  long lVar5;
  undefined8 uVar6;
  Accuracy *in_RDX;
  Variable<unsigned_int> *in_RDI;
  Variable<unsigned_int> *unaff_retaddr;
  Engine *in_stack_00000008;
  Engine *in_stack_00000010;
  string ExprStr;
  uint value;
  logic_error *anon_var_0;
  MinMaxStruct MinMax;
  size_t j_1;
  Dims *d_1;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> signo;
  size_t j;
  Dims d;
  bool isGlobalValue;
  int retval;
  DataType adiosvartype;
  size_t nsteps;
  Variable<unsigned_int> *in_stack_00000260;
  IO *in_stack_00000268;
  Engine *in_stack_00000270;
  Variable<unsigned_int> *in_stack_00000398;
  IO *in_stack_000003a0;
  Engine *in_stack_000003a8;
  char *local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe00;
  FILE *pFVar7;
  char *local_1f0;
  char *local_1e0;
  unsigned_long in_stack_fffffffffffffe28;
  FILE *pFVar8;
  char *local_1d0;
  char *local_1b8;
  string local_1a8 [36];
  undefined1 local_184 [12];
  undefined1 local_178 [47];
  byte local_149;
  string local_148 [32];
  ulong local_128;
  byte local_119;
  string local_118 [39];
  byte local_f1;
  string local_f0 [14];
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  DataType in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Variable<unsigned_int> *in_stack_ffffffffffffff28;
  IO *in_stack_ffffffffffffff30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  Engine *in_stack_ffffffffffffff38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_c0;
  byte local_a1;
  string local_a0 [32];
  ulong local_80;
  byte local_75;
  string local_68 [32];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  undefined1 local_29;
  int local_28;
  undefined4 local_24;
  ulong local_20;
  Accuracy *local_18;
  
  local_18 = in_RDX;
  local_20 = adios2::core::VariableBase::GetAvailableStepsCount();
  if ((timestep & 1) != 0) {
    local_20 = 1;
  }
  local_24 = *(undefined4 *)&local_18[1].relative;
  local_28 = 0;
  local_29 = (local_20 == 1 & *(byte *)((long)&local_18[3].norm + 4) & 1) != 0 &&
             *(int *)&local_18[2].relative != 2;
  if ((bool)local_29) {
    fprintf(outf,"  scalar");
    if (((longopt & 1) != 0) && ((timestep & 1) == 0)) {
      fprintf(outf," = ");
      adios2::core::Engine::Get<unsigned_int>((Variable *)in_RDI,(uint *)local_18,(Mode)local_184);
      print_data(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                 (bool)in_stack_ffffffffffffff1f,(bool)in_stack_ffffffffffffff1e);
    }
    fprintf(outf,"\n");
    if ((show_decomp & 1) != 0) {
      if ((timestep & 1) == 0) {
        print_decomp<unsigned_int>(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      }
      else {
        print_decomp_singlestep<unsigned_int>
                  (in_stack_00000010,(IO *)in_stack_00000008,unaff_retaddr);
      }
    }
  }
  else {
    fprintf(outf,"  ");
    if (1 < local_20) {
      fprintf(outf,"%zu*",local_20);
    }
    if (*(int *)&local_18[2].relative == 2) {
      get_global_array_signature<unsigned_int>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pFVar8 = outf;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_48,0);
      local_75 = 0;
      if (*pvVar3 == 0) {
        local_1b8 = "__";
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_48,0);
        std::__cxx11::to_string(in_stack_fffffffffffffe28);
        local_75 = 1;
        local_1b8 = (char *)std::__cxx11::string::c_str();
      }
      fprintf(pFVar8,"{%s",local_1b8);
      if ((local_75 & 1) != 0) {
        std::__cxx11::string::~string(local_68);
      }
      for (local_80 = 1; uVar1 = local_80,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &local_18[3].relative), pFVar8 = outf, uVar1 < sVar4;
          local_80 = local_80 + 1) {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_48,local_80);
        local_a1 = 0;
        if (*pvVar3 == 0) {
          local_1d0 = "__";
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_48,local_80)
          ;
          std::__cxx11::to_string(in_stack_fffffffffffffe28);
          local_a1 = 1;
          local_1d0 = (char *)std::__cxx11::string::c_str();
        }
        fprintf(pFVar8,", %s",local_1d0);
        if ((local_a1 & 1) != 0) {
          std::__cxx11::string::~string(local_a0);
        }
      }
      fprintf(outf,"}");
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe00)
      ;
    }
    else if (*(int *)&local_18[2].relative == 5) {
      get_local_array_signature<unsigned_int>(in_stack_00000008,(IO *)unaff_retaddr,in_RDI);
      this = &vStack_c0;
      local_f1 = 0;
      pFVar8 = outf;
      if (in_stack_ffffffffffffff38 == (Engine *)0x0) {
        local_1e0 = "__";
      }
      else {
        std::__cxx11::to_string((unsigned_long)outf);
        local_f1 = 1;
        local_1e0 = (char *)std::__cxx11::string::c_str();
      }
      fprintf(pFVar8,"[%s]*",local_1e0);
      if ((local_f1 & 1) != 0) {
        std::__cxx11::string::~string(local_f0);
      }
      pFVar7 = outf;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
      local_119 = 0;
      if (*pvVar3 == 0) {
        local_1f0 = "__";
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
        std::__cxx11::to_string((unsigned_long)pFVar8);
        local_119 = 1;
        local_1f0 = (char *)std::__cxx11::string::c_str();
      }
      fprintf(pFVar7,"{%s",local_1f0);
      if ((local_119 & 1) != 0) {
        std::__cxx11::string::~string(local_118);
      }
      for (local_128 = 1; uVar1 = local_128,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &local_18[5].relative), uVar1 < sVar4; local_128 = local_128 + 1) {
        pFVar7 = outf;
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (this,local_128);
        local_149 = 0;
        if (*pvVar3 == 0) {
          local_208 = "__";
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,local_128);
          std::__cxx11::to_string((unsigned_long)pFVar8);
          local_149 = 1;
          local_208 = (char *)std::__cxx11::string::c_str();
        }
        fprintf(pFVar7,", %s",local_208);
        if ((local_149 & 1) != 0) {
          std::__cxx11::string::~string(local_148);
        }
      }
      fprintf(outf,"}");
      std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~pair
                ((pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )0x15b85e);
    }
    else {
      fprintf(outf,"scalar");
    }
    if (((longopt & 1) != 0) && ((timestep & 1) == 0)) {
      bVar2 = (**(code **)(*(long *)in_RDI + 0x70))(in_RDI,local_18,0xffffffffffffffff,local_178);
      if ((bVar2 & 1) == 0) {
        fprintf(outf," = ");
        print_data(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                   (bool)in_stack_ffffffffffffff1f,(bool)in_stack_ffffffffffffff1e);
        fprintf(outf," / ");
        print_data(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                   (bool)in_stack_ffffffffffffff1f,(bool)in_stack_ffffffffffffff1e);
      }
      else {
        fprintf(outf," = ");
        print_data(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                   (bool)in_stack_ffffffffffffff1f,(bool)in_stack_ffffffffffffff1e);
        fprintf(outf," / ");
        print_data(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                   (bool)in_stack_ffffffffffffff1f,(bool)in_stack_ffffffffffffff1e);
      }
    }
    fprintf(outf,"\n");
    if ((show_decomp & 1) != 0) {
      if ((timestep & 1) == 0) {
        print_decomp<unsigned_int>(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      }
      else {
        print_decomp_singlestep<unsigned_int>
                  (in_stack_00000010,(IO *)in_stack_00000008,unaff_retaddr);
      }
    }
  }
  if ((show_derived_expr & 1) != 0) {
    (**(code **)(*(long *)in_RDI + 0x78))(local_1a8,in_RDI,local_18);
    lVar5 = std::__cxx11::string::size();
    pFVar8 = outf;
    if (lVar5 != 0) {
      uVar6 = std::__cxx11::string::c_str();
      fprintf(pFVar8,"    Derived variable with expression: %s\n",uVar6);
    }
    std::__cxx11::string::~string(local_1a8);
  }
  if (((dump & 1) != 0) && ((show_decomp & 1) == 0)) {
    adios2::core::VariableBase::SetAccuracy(local_18);
    if (*(int *)&local_18[2].relative == 5) {
      if ((timestep & 1) == 0) {
        print_decomp<unsigned_int>(in_stack_00000270,in_stack_00000268,in_stack_00000260);
      }
      else {
        print_decomp_singlestep<unsigned_int>
                  (in_stack_00000010,(IO *)in_stack_00000008,unaff_retaddr);
      }
    }
    else {
      local_28 = readVar<unsigned_int>(in_stack_000003a8,in_stack_000003a0,in_stack_00000398);
    }
    fprintf(outf,"\n");
  }
  return local_28;
}

Assistant:

int printVariableInfo(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    size_t nsteps = variable->GetAvailableStepsCount();
    if (timestep)
    {
        nsteps = 1;
    }
    DataType adiosvartype = variable->m_Type;
    int retval = 0;

    bool isGlobalValue = (nsteps == 1);
    isGlobalValue &= variable->m_SingleValue;
    isGlobalValue &= (variable->m_ShapeID != ShapeID::GlobalArray);

    if (!isGlobalValue)
    {
        fprintf(outf, "  ");

        if (nsteps > 1)
            fprintf(outf, "%zu*", nsteps);

        if (variable->m_ShapeID == ShapeID::GlobalArray)
        {
            Dims d = get_global_array_signature(fp, io, variable);
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Shape.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            std::pair<size_t, Dims> signo = get_local_array_signature(fp, io, variable);
            Dims &d = signo.second;
            fprintf(outf, "[%s]*", signo.first > 0 ? std::to_string(signo.first).c_str() : "__");
            fprintf(outf, "{%s", d[0] > 0 ? std::to_string(d[0]).c_str() : "__");
            for (size_t j = 1; j < variable->m_Count.size(); j++)
            {
                fprintf(outf, ", %s", d[j] > 0 ? std::to_string(d[j]).c_str() : "__");
            }
            fprintf(outf, "}");
        }
        else
        {
            fprintf(outf, "scalar");
        }
#if 0
        if (longopt || plot)
        {
            adios_inq_var_stat(fp, vi, timestep && timed, show_decomp);
        }

        if (plot && vi->statistics && vi->statistics->histogram)
        {
            print_data_hist(vi, &names[n][1]);
        }
#endif
        if (longopt /* TODO: && variable->has_statistics */)
        {
            if (timestep == false)
            {
                MinMaxStruct MinMax;
                try
                {
                    if (fp->VariableMinMax(*variable, DefaultSizeT, MinMax))
                    {
                        fprintf(outf, " = ");
                        print_data(&MinMax.MinUnion, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&MinMax.MaxUnion, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&variable->m_Min, 0, adiosvartype, false);
                        fprintf(outf, " / ");
                        print_data(&variable->m_Max, 0, adiosvartype, false);
                    }
                    // fprintf(outf," {MIN / MAX} ");
                }
                catch (std::logic_error &)
                {
                }
            }
#if 0
            else
            {
                int time_start = 0, time_end = vi->nsteps;

                if (start != NULL)
                {
                    if (istart[0] >= 0)
                        time_start = istart[0];
                    else
                        time_start = vi->nsteps - 1 + (int)istart[0];
                }

                if (count != NULL)
                {
                    if (icount[0] > 0)
                        time_end = time_start + (int)icount[0];
                    else
                        time_end = vi->nsteps + (int)icount[0] + 1;
                }

                if (time_start < 0 || time_start >= vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_start);
                    bpexit(15, fp);
                }

                if (time_end < 0 || time_end > vi->nsteps)
                {
                    fprintf(stderr, "Error when reading variable %s. "
                                    "errno=%d : Variable (id=%d) has "
                                    "no data at %d time step\n",
                            names[n], 15, vi->varid, time_end);
                    bpexit(16, fp);
                }

                static char *indent_char = " ";
                int indent_len = 11;

                /* Start - Print the headers of statistics first */
                fprintf(outf, "\n%-*s", indent_len + 7, indent_char);
                fprintf(outf, "%10s  ", "MIN");
                fprintf(outf, "%10s  ", "MAX");
                fprintf(outf, "%10s  ", "AVG");
                fprintf(outf, "%10s  ", "STD DEV");

                /* End - Print the headers of statistics first */

                void *min, *max, *avg, *std_dev;
                DataType vt = vartype;
                struct ADIOS_STAT_STEP *s = vi->statistics->steps;
                if (vi->type == DataType::FloatComplex ||
                    vi->type == DataType::DoubleComplex)
                    vt = DataType::Double;
                fprintf(outf, "\n%-*sglobal:", indent_len, indent_char);
                print_data_characteristics(
                    vi->statistics->min, vi->statistics->max,
                    vi->statistics->avg, vi->statistics->std_dev, vt, false);

                for (i = time_start; i < time_end; i++)
                {
                    min = max = avg = std_dev = 0;
                    if (s->maxs && s->maxs[i])
                        max = s->maxs[i];
                    if (s->mins && s->mins[i])
                        min = s->mins[i];
                    if (s->avgs && s->avgs[i])
                        avg = s->avgs[i];
                    if (s->std_devs && s->std_devs[i])
                        std_dev = s->std_devs[i];

                    // Align the output, previous lines has atleast
                    // (maxlen + strlen(names[n])) characters
                    // Better way to printf N spaces?
                    fprintf(outf, "\n%-*st%-5d:", indent_len, indent_char, i);
                    print_data_characteristics(min, max, avg, std_dev, vt,
                                               false);
                }
                fprintf(outf, "\n");
            }
#endif
        } // longopt && vi->statistics
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }
    else
    {
        // single GlobalValue without timesteps
        fprintf(outf, "  scalar");
        if (longopt && !timestep)
        {
            fprintf(outf, " = ");
            T value;
            fp->Get(*variable, value, adios2::Mode::Sync);
            print_data(&value, 0, adiosvartype, false);
        }
        fprintf(outf, "\n");

        if (show_decomp)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
    }

    if (show_derived_expr)
    {
        std::string ExprStr = fp->VariableExprStr(*variable);
        if (ExprStr.size() > 0)
        {
            fprintf(outf, "    Derived variable with expression: %s\n", ExprStr.c_str());
        }
    }

    if (dump && !show_decomp)
    {
        variable->SetAccuracy(accuracy);
        // print variable content
        if (variable->m_ShapeID == ShapeID::LocalArray)
        {
            if (timestep)
            {
                print_decomp_singlestep(fp, io, variable);
            }
            else
            {
                print_decomp(fp, io, variable);
            }
        }
        else
        {
            retval = readVar(fp, io, variable);
        }
        fprintf(outf, "\n");
    }
    return retval;
}